

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O0

WW<66UL> * __thiscall GF2::WW<131ul>::GetHi<66ul>(WW<131UL> *this,WW<66UL> *w)

{
  WW<66UL> *in_RSI;
  long in_RDI;
  size_t offset;
  size_t pos;
  size_t start;
  ulong local_20;
  
  for (local_20 = 0; local_20 + 2 < 3; local_20 = local_20 + 1) {
    in_RSI->_words[local_20] =
         *(ulong *)(in_RDI + (local_20 + 1) * 8) >> 1 |
         *(long *)(in_RDI + 8 + (local_20 + 1) * 8) << 0x3f;
  }
  if (local_20 < 2) {
    in_RSI->_words[local_20] = *(ulong *)(in_RDI + (local_20 + 1) * 8) >> 1;
  }
  WW<66UL>::Trim(in_RSI);
  return in_RSI;
}

Assistant:

WW<_m>& GetHi(WW<_m>& w) const
	{
		static_assert(_m <= _n);
		// первое слово, в котором начинается правая часть
		size_t start = (_n - _m) / B_PER_W;
		// правая часть начинается посередине слова (со смещением offset)?
		size_t pos;
		if (size_t offset = (_n - _m) % B_PER_W)
		{
			// объединять биты двух последовательных слов
			for (pos = 0; pos + start + 1 < _wcount; pos++)
				w._words[pos] = (_words[pos + start] >> offset) | 
					(_words[pos + start + 1] << (B_PER_W - offset));
			// использовать биты последнего слова
			if (pos < w._wcount)
				w._words[pos] = _words[pos + start] >> offset;
			w.Trim();
		}
		else
			for (pos = 0; pos < w._wcount; ++pos)
				w._words[pos] = _words[pos + start];
		return w;
	}